

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::FreeBuffer(CopyingInputStreamAdaptor *this)

{
  int v1;
  int v2;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_30 [23];
  Voidify local_19;
  string *local_18;
  string *absl_log_internal_check_op_result;
  CopyingInputStreamAdaptor *this_local;
  
  absl_log_internal_check_op_result = (string *)this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue(this->backup_bytes_);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_18 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_(v1,v2,"backup_bytes_ == 0");
  if (local_18 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x111,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  this->buffer_used_ = 0;
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::reset
            (&this->buffer_,(nullptr_t)0x0);
  return;
}

Assistant:

void CopyingInputStreamAdaptor::FreeBuffer() {
  ABSL_CHECK_EQ(backup_bytes_, 0);
  buffer_used_ = 0;
  buffer_.reset();
}